

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkForeachIteratorCapturedByClosure
          (CheckerVisitor *this,Id *id,ValueRef *v)

{
  int iVar1;
  FunctionDecl *pFVar2;
  pointer pSVar3;
  Node *pNVar4;
  long lVar5;
  _func_int **pp_Var6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  SQChar *name;
  bool bVar10;
  
  if (this->effectsOnly != false) {
    return;
  }
  if (v->info->kind != SK_FOREACH) {
    return;
  }
  pFVar2 = this->currentScope->owner;
  if (v->info->ownedScope->owner == pFVar2) {
    return;
  }
  pSVar3 = (this->nodeStack).
           super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((ulong)((long)(this->nodeStack).
                              super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 4) - 1;
  do {
    if ((int)uVar8 < 0) break;
    bVar9 = (FunctionDecl *)pSVar3[uVar8].field_1.n != pFVar2 || pSVar3[uVar8].sst != SST_NODE;
    uVar8 = uVar8 - bVar9;
  } while (bVar9);
  if (((((int)uVar8 < 3) || (pSVar3[(ulong)uVar8 - 2].sst != SST_NODE)) ||
      (pNVar4 = pSVar3[(ulong)uVar8 - 2].field_1.n, pNVar4->_op != TO_CALL)) ||
     ((ulong)pNVar4[1]._op == 0)) goto LAB_00150bae;
  bVar9 = false;
  lVar7 = 0;
  do {
    lVar5 = *(long *)(*(long *)&pNVar4[1]._coordinates.lineEnd + lVar7);
    if ((*(int *)(lVar5 + 0x18) == 0x3d) && (*(FunctionDecl **)(lVar5 + 0x20) == pFVar2)) {
      bVar9 = true;
      bVar10 = true;
    }
    else {
      bVar10 = false;
    }
  } while ((!bVar10) && (bVar10 = (ulong)pNVar4[1]._op * 8 + -8 != lVar7, lVar7 = lVar7 + 8, bVar10)
          );
  if (!bVar9) goto LAB_00150bae;
  pp_Var6 = pNVar4[1].super_ArenaObj._vptr_ArenaObj;
  iVar1 = *(int *)(pp_Var6 + 3);
  if (iVar1 == 0x11) {
    lVar7 = 0x20;
LAB_00150b90:
    name = *(SQChar **)((long)pp_Var6 + lVar7);
  }
  else {
    if (iVar1 == 0x3f) {
      lVar7 = 0x30;
      goto LAB_00150b90;
    }
    name = (SQChar *)0x0;
  }
  if ((name != (SQChar *)0x0) && (bVar9 = nameLooksLikeCallsLambdaInPlace(name), bVar9)) {
    return;
  }
LAB_00150bae:
  report(this,(Node *)id,0x71,id->_id);
  return;
}

Assistant:

void CheckerVisitor::checkForeachIteratorCapturedByClosure(const Id *id, const ValueRef *v) {
  if (effectsOnly)
    return;

  if (v->info->kind != SK_FOREACH)
    return;

  const FunctionDecl *thisScopeOwner = currentScope->owner;

  if (v->info->ownedScope->owner == currentScope->owner)
    return;

  int32_t i = nodeStack.size() - 1;
  assert(i > 0);

  int32_t thisId = -1;
  auto rit = nodeStack.rbegin();
  auto rie = nodeStack.rend();

  while (i >= 0) {
    auto &m = nodeStack[i];

    if (m.sst == SST_NODE) {
      if (m.n == thisScopeOwner) {
        thisId = i;
        break;
      }
    }
    --i;
  }

  assert(thisId > 0);

  if (i > 2) { // decl_expr + call + foreach

    auto &candidate = nodeStack[i - 2];

    if (candidate.sst == SST_NODE && candidate.n->op() == TO_CALL) {
      const CallExpr *call = candidate.n->asExpression()->asCallExpr();

      bool found = false;
      for (auto arg : call->arguments()) {
        if (arg->op() == TO_DECL_EXPR && arg->asDeclExpr()->declaration() == thisScopeOwner) {
          found = true;
          break;
        }
      }

      if (found) {// in call arguments
        const Expr *callee = call->callee();
        const SQChar *name = nullptr;

        if (callee->op() == TO_ID)
          name = callee->asId()->id();
        else if (callee->op() == TO_GETFIELD)
          name = callee->asGetField()->fieldName();

        if (name && nameLooksLikeCallsLambdaInPlace(name)) {
          return;
        }
      }
    }
  }

  report(id, DiagnosticsId::DI_ITER_IN_CLOSURE, id->id());
}